

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NearestNeighborsIndex::clear_IndexType(NearestNeighborsIndex *this)

{
  if (((this->_oneof_case_[0] == 0x6e) || (this->_oneof_case_[0] == 100)) &&
     ((this->IndexType_).linearindex_ != (LinearIndex *)0x0)) {
    (*(((this->IndexType_).linearindex_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void NearestNeighborsIndex::clear_IndexType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.NearestNeighborsIndex)
  switch (IndexType_case()) {
    case kLinearIndex: {
      delete IndexType_.linearindex_;
      break;
    }
    case kSingleKdTreeIndex: {
      delete IndexType_.singlekdtreeindex_;
      break;
    }
    case INDEXTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = INDEXTYPE_NOT_SET;
}